

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Yolov3DetectionOutput_x86_avx::forward
          (Yolov3DetectionOutput_x86_avx *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  pointer pMVar3;
  void *pvVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  int iVar13;
  uint *puVar14;
  ulong uVar15;
  _func_int *p_Var16;
  undefined4 *puVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  Mat *pMVar22;
  float *pfVar23;
  float *pfVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  float *pfVar30;
  float *pfVar31;
  int i;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 extraout_var [60];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  float fVar54;
  undefined1 auVar49 [16];
  float fVar55;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 in_ZMM3 [64];
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [16];
  long local_210;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  undefined8 local_1e8;
  float *local_1b8;
  int local_1b0;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  all_box_bbox_rects;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  int local_a8;
  
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar25 = 0;
  do {
    if ((ulong)(((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar25) {
      Yolov3DetectionOutput::qsort_descent_inplace
                ((Yolov3DetectionOutput *)
                 ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx +
                 (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]),&all_bbox_rects);
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Yolov3DetectionOutput::nms_sorted_bboxes
                ((Yolov3DetectionOutput *)
                 ((long)&this->_vptr_Yolov3DetectionOutput_x86_avx +
                 (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]),&all_bbox_rects,&picked,
                 *(float *)(&this->field_0xdc + (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3])
                );
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0.0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0.0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      for (uVar25 = 0;
          uVar25 < (ulong)((long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar25 = uVar25 + 1
          ) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ::push_back(&bbox_rects,
                    all_bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar25]);
      }
      uVar25 = ((long)bbox_rects.
                      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               CONCAT44(bbox_rects.
                        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                        bbox_rects.
                        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                        ._M_impl.super__Vector_impl_data._M_start._0_4_)) / 0x1c;
      iVar29 = (int)uVar25;
      if (iVar29 == 0) {
        iVar13 = 0;
      }
      else {
        pMVar22 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        Mat::create(pMVar22,6,iVar29,4,opt->blob_allocator);
        pvVar4 = pMVar22->data;
        iVar13 = -100;
        if ((pvVar4 != (void *)0x0) && ((long)pMVar22->c * pMVar22->cstep != 0)) {
          puVar17 = (undefined4 *)
                    CONCAT44(bbox_rects.
                             super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             bbox_rects.
                             super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_4_);
          iVar13 = 0;
          uVar25 = uVar25 & 0xffffffff;
          if (iVar29 < 1) {
            uVar25 = 0;
          }
          for (uVar21 = 0; uVar25 != uVar21; uVar21 = uVar21 + 1) {
            uVar2 = *puVar17;
            lVar26 = (long)pMVar22->w * uVar21 * pMVar22->elemsize;
            *(float *)((long)pvVar4 + lVar26) = (float)(puVar17[6] + 1);
            *(undefined4 *)((long)pvVar4 + lVar26 + 4) = uVar2;
            *(undefined4 *)((long)pvVar4 + lVar26 + 8) = puVar17[1];
            *(undefined4 *)((long)pvVar4 + lVar26 + 0xc) = puVar17[2];
            *(undefined4 *)((long)pvVar4 + lVar26 + 0x10) = puVar17[3];
            *(undefined4 *)((long)pvVar4 + lVar26 + 0x14) = puVar17[4];
            puVar17 = puVar17 + 7;
          }
        }
      }
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_00280f73:
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&all_bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      return iVar13;
    }
    all_box_bbox_rects.
    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    all_box_bbox_rects.
    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_box_bbox_rects.
    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize(&all_box_bbox_rects,
             (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3])
            );
    pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    p_Var16 = this->_vptr_Yolov3DetectionOutput_x86_avx[-3];
    iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var16);
    iVar13 = pMVar3[uVar25].c / iVar29;
    if (iVar13 != *(int *)(&this->field_0xd0 + (long)p_Var16) + 5) {
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&all_box_bbox_rects);
      iVar13 = -1;
      goto LAB_00280f73;
    }
    pMVar22 = pMVar3 + uVar25;
    lVar26 = (long)iVar29;
    uVar21._0_4_ = pMVar22->w;
    uVar21._4_4_ = pMVar22->h;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar21;
    auVar35 = vcvtdq2ps_avx(auVar35);
    fVar1 = *(float *)(*(long *)(&this->field_0x170 + (long)p_Var16) + uVar25 * 4);
    fVar5 = auVar35._0_4_;
    auVar42._0_4_ = fVar1 * fVar5;
    fVar6 = auVar35._4_4_;
    auVar42._4_4_ = fVar1 * fVar6;
    auVar42._8_4_ = fVar1 * auVar35._8_4_;
    auVar42._12_4_ = fVar1 * auVar35._12_4_;
    uVar18 = 0;
    if (0 < (int)(undefined4)uVar21) {
      uVar18 = uVar21 & 0xffffffff;
    }
    auVar42 = vroundps_avx(auVar42,0xb);
    uVar27 = uVar21 >> 0x20;
    if (uVar21._4_4_ == 0 || (long)uVar21 < 0) {
      uVar27 = 0;
    }
    auVar43._0_12_ = ZEXT412(0x3f000000) << 0x40;
    auVar43._12_4_ = 0x3f000000;
    auVar44._8_8_ = auVar43._8_8_;
    auVar44._0_8_ = auVar35._0_8_;
    auVar35 = vrcpps_avx(auVar44);
    fVar1 = auVar35._0_4_;
    auVar45._0_4_ = fVar5 * fVar1;
    fVar7 = auVar35._4_4_;
    auVar45._4_4_ = fVar6 * fVar7;
    fVar8 = auVar35._8_4_;
    auVar45._8_4_ = fVar8 * 0.5;
    fVar9 = auVar35._12_4_;
    auVar45._12_4_ = fVar9 * 0.5;
    auVar49._8_4_ = 0x3f800000;
    auVar49._0_8_ = 0x3f8000003f800000;
    auVar49._12_4_ = 0x3f800000;
    auVar35 = vsubps_avx(auVar49,auVar45);
    for (lVar19 = 0; lVar19 < iVar29; lVar19 = lVar19 + 1) {
      iVar29 = (int)lVar19 * iVar13;
      uVar15 = *(ulong *)(*(long *)(&this->field_0xe0 + (long)p_Var16) +
                         (long)((int)*(float *)(*(long *)(&this->field_0x128 + (long)p_Var16) +
                                                lVar26 * uVar25 * 4 + lVar19 * 4) * 2) * 4);
      Mat::channel((Mat *)&picked,pMVar22,iVar29);
      pfVar23 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&picked);
      Mat::channel((Mat *)&picked,pMVar22,iVar29 + 1);
      pfVar24 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&picked);
      Mat::channel((Mat *)&picked,pMVar22,iVar29 + 2);
      pfVar31 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&picked);
      Mat::channel((Mat *)&picked,pMVar22,iVar29 + 3);
      local_1b8 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&picked);
      Mat::channel((Mat *)&picked,pMVar22,iVar29 + 4);
      pfVar30 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&picked);
      Mat::channel_range((Mat *)&picked,pMVar22,iVar29 + 5,
                         *(int *)(&this->field_0xd0 +
                                 (long)this->_vptr_Yolov3DetectionOutput_x86_avx[-3]));
      auVar36._8_4_ = 0x3f800000;
      auVar36._0_8_ = 0x3f8000003f800000;
      auVar36._12_4_ = 0x3f800000;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar15;
      auVar43 = vunpcklpd_avx(auVar36,auVar10);
      local_210 = 0;
      for (uVar15 = 0; uVar15 != uVar27; uVar15 = uVar15 + 1) {
        auVar37._0_4_ = (float)(int)uVar15;
        auVar37._4_12_ = in_ZMM3._4_12_;
        auVar44 = vshufps_avx(auVar37,auVar42,0x40);
        lVar28 = local_210;
        for (uVar20 = 0; uVar20 != uVar18; uVar20 = uVar20 + 1) {
          p_Var16 = this->_vptr_Yolov3DetectionOutput_x86_avx[-3];
          puVar14 = (uint *)((long)picked.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar28);
          auVar48 = ZEXT464(0xff7fffff);
          while( true ) {
            if ((uint *)((long)picked.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start +
                        (long)*(int *)(&this->field_0xd0 + (long)p_Var16) * (long)local_a8 * 4 +
                        uVar20 * 4 + uVar15 * (long)(int)(undefined4)uVar21 * 4) <= puVar14) break;
            auVar45 = vmaxss_avx(ZEXT416(*puVar14),auVar48._0_16_);
            auVar48 = ZEXT1664(auVar45);
            puVar14 = puVar14 + local_a8;
          }
          fVar32 = expf(-*pfVar30);
          fVar33 = expf(-auVar48._0_4_);
          fVar32 = 1.0 / ((fVar33 + 1.0) * fVar32 + 1.0);
          if (*(float *)(&this->field_0xd8 + (long)p_Var16) <= fVar32) {
            fVar33 = expf(-*pfVar23);
            fVar34 = expf(-*pfVar24);
            auVar45 = vinsertps_avx(ZEXT416((uint)(fVar33 + 1.0)),ZEXT416((uint)(fVar34 + 1.0)),0x10
                                   );
            fVar33 = expf(*pfVar31);
            local_1e8 = CONCAT44(extraout_XMM0_Db,fVar33);
            auVar48._0_4_ = expf(*local_1b8);
            auVar48._4_60_ = extraout_var;
            auVar49 = vrcpps_avx(auVar45);
            fVar33 = auVar43._0_4_ * auVar49._0_4_;
            fVar34 = auVar43._4_4_ * auVar49._4_4_;
            fVar54 = auVar43._8_4_ * auVar49._8_4_;
            fVar55 = auVar43._12_4_ * auVar49._12_4_;
            auVar56._0_4_ = auVar45._0_4_ * fVar33;
            auVar56._4_4_ = auVar45._4_4_ * fVar34;
            auVar56._8_4_ = auVar45._8_4_ * fVar54;
            auVar56._12_4_ = auVar45._12_4_ * fVar55;
            auVar10 = vsubps_avx(auVar43,auVar56);
            fVar33 = fVar33 + auVar49._0_4_ * auVar10._0_4_;
            fVar34 = fVar34 + auVar49._4_4_ * auVar10._4_4_;
            auVar39._4_4_ = fVar34;
            auVar39._0_4_ = fVar33;
            auVar50._8_8_ = local_1e8;
            auVar50._0_8_ = local_1e8;
            auVar45 = vinsertps_avx(auVar50,auVar48._0_16_,0x30);
            auVar11._4_8_ = auVar45._8_8_;
            auVar11._0_4_ = auVar43._4_4_ * auVar45._4_4_;
            auVar38._0_8_ = auVar11._0_8_ << 0x20;
            auVar38._8_4_ = auVar43._8_4_ * auVar45._8_4_;
            auVar38._12_4_ = auVar43._12_4_ * auVar45._12_4_;
            local_1b0 = (int)uVar20;
            auVar51._0_4_ = (float)local_1b0;
            auVar51._4_12_ = auVar44._4_12_;
            auVar39._8_8_ = auVar38._8_8_;
            auVar45 = vrcpps_avx(auVar51);
            fVar57 = fVar33 * auVar45._0_4_;
            fVar58 = fVar34 * auVar45._4_4_;
            fVar59 = auVar38._8_4_ * auVar45._8_4_;
            fVar60 = auVar38._12_4_ * auVar45._12_4_;
            auVar61._0_4_ = auVar51._0_4_ * fVar57;
            auVar61._4_4_ = auVar44._4_4_ * fVar58;
            auVar61._8_4_ = auVar44._8_4_ * fVar59;
            auVar61._12_4_ = auVar44._12_4_ * fVar60;
            auVar36 = vsubps_avx(auVar39,auVar61);
            auVar40._0_4_ = fVar57 + auVar45._0_4_ * auVar36._0_4_;
            auVar40._4_4_ = fVar58 + auVar45._4_4_ * auVar36._4_4_;
            auVar40._8_4_ = fVar59 + auVar45._8_4_ * auVar36._8_4_;
            auVar40._12_4_ = fVar60 + auVar45._12_4_ * auVar36._12_4_;
            auVar46._0_4_ = (fVar33 + auVar51._0_4_) * (fVar1 + fVar1 * auVar35._0_4_);
            auVar46._4_4_ = (fVar34 + auVar44._4_4_) * (fVar7 + fVar7 * auVar35._4_4_);
            auVar46._8_4_ =
                 (fVar54 + auVar49._8_4_ * auVar10._8_4_ + auVar44._8_4_) *
                 (fVar8 + fVar8 * auVar35._8_4_);
            auVar46._12_4_ =
                 (fVar55 + auVar49._12_4_ * auVar10._12_4_ + auVar44._12_4_) *
                 (fVar9 + fVar9 * auVar35._12_4_);
            auVar52._0_4_ = auVar40._0_4_ * fVar5;
            auVar52._4_4_ = auVar40._4_4_ * fVar6;
            auVar52._8_4_ = auVar40._8_4_ * 0.5;
            auVar52._12_4_ = auVar40._12_4_ * 0.5;
            auVar45 = vshufpd_avx(auVar52,auVar46,1);
            in_ZMM3 = ZEXT1664(auVar45);
            auVar49 = vsubps_avx(auVar46,auVar45);
            auVar12._4_8_ = auVar52._8_8_;
            auVar12._0_4_ = auVar52._4_4_ + auVar45._4_4_;
            auVar53._0_8_ = auVar12._0_8_ << 0x20;
            auVar53._8_4_ = auVar52._8_4_ + auVar45._8_4_;
            auVar53._12_4_ = auVar52._12_4_ + auVar45._12_4_;
            auVar47._0_8_ = auVar49._0_8_;
            auVar47._8_8_ = auVar53._8_8_;
            auVar45 = vmovshdup_avx(auVar40);
            auVar41._0_4_ = auVar45._0_4_ * auVar40._0_4_;
            auVar41._4_4_ = auVar45._4_4_ * auVar40._4_4_;
            auVar41._8_4_ = auVar45._8_4_ * auVar40._8_4_;
            auVar41._12_4_ = auVar45._12_4_ * auVar40._12_4_;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = auVar49._0_4_;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_finish = auVar47._4_8_;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = vextractps_avx(auVar41,2);
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = fVar32;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = auVar53._12_4_;
            std::
            vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ::push_back(all_box_bbox_rects.
                        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar19,(value_type *)&bbox_rects
                       );
          }
          pfVar23 = pfVar23 + 1;
          pfVar24 = pfVar24 + 1;
          pfVar31 = pfVar31 + 1;
          local_1b8 = local_1b8 + 1;
          pfVar30 = pfVar30 + 1;
          lVar28 = lVar28 + 4;
        }
        local_210 = local_210 + (long)(int)(undefined4)uVar21 * 4;
      }
      Mat::~Mat((Mat *)&picked);
      p_Var16 = this->_vptr_Yolov3DetectionOutput_x86_avx[-3];
      iVar29 = *(int *)(&this->field_0xd4 + (long)p_Var16);
    }
    lVar26 = 8;
    for (lVar19 = 0; lVar19 < *(int *)(&this->field_0xd4 + (long)p_Var16); lVar19 = lVar19 + 1) {
      std::
      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
      ::
      insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                  *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)all_box_bbox_rects.
                         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar26 + -8),
                 *(BBoxRect **)
                  ((long)&((all_box_bbox_rects.
                            super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar26));
      p_Var16 = this->_vptr_Yolov3DetectionOutput_x86_avx[-3];
      lVar26 = lVar26 + 0x18;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector(&all_box_bbox_rects);
    uVar25 = uVar25 + 1;
  } while( true );
}

Assistant:

int Yolov3DetectionOutput_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = scores.cstep;

#if __AVX__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}